

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

int __thiscall
google::protobuf::Reflection::GetEnumValue(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  EnumValueDescriptor *this_00;
  int *piVar6;
  FieldDescriptor *in_RDX;
  long *in_RDI;
  int32 value;
  char *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_00000068;
  CppType in_stack_0000006c;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000078;
  int in_stack_00000080;
  int in_stack_00000084;
  ExtensionSet *in_stack_00000088;
  Message *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  
  pDVar5 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar5 != (Descriptor *)*in_RDI) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,(FieldDescriptor *)CONCAT44(in_stack_0000006c,in_stack_00000068),
               in_stack_00000060,in_stack_00000058);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d60da);
  if (CVar3 != CPPTYPE_ENUM) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)CONCAT44(in_stack_00000084,in_stack_00000080),in_stack_00000078,
               (char *)in_stack_00000070,in_stack_0000006c);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet((Reflection *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
    iVar4 = FieldDescriptor::number(in_RDX);
    this_00 = FieldDescriptor::default_value_enum
                        ((FieldDescriptor *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
    EnumValueDescriptor::number(this_00);
    local_1c = internal::ExtensionSet::GetEnum
                         (in_stack_00000088,in_stack_00000084,in_stack_00000080);
  }
  else {
    piVar6 = GetField<int>((Reflection *)
                           CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffc8,(FieldDescriptor *)0x6d6169);
    local_1c = *piVar6;
  }
  return local_1c;
}

Assistant:

int Reflection::GetEnumValue(const Message& message,
                             const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetEnumValue, SINGULAR, ENUM);

  int32 value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetEnum(
        field->number(), field->default_value_enum()->number());
  } else {
    value = GetField<int>(message, field);
  }
  return value;
}